

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_freeaddrinfo.c
# Opt level: O1

void ares_freeaddrinfo_nodes(ares_addrinfo_node *head)

{
  ares_addrinfo_node *paVar1;
  
  if (head != (ares_addrinfo_node *)0x0) {
    do {
      paVar1 = head->ai_next;
      ares_free(head->ai_addr);
      ares_free(head);
      head = paVar1;
    } while (paVar1 != (ares_addrinfo_node *)0x0);
  }
  return;
}

Assistant:

void ares_freeaddrinfo_nodes(struct ares_addrinfo_node *head)
{
  struct ares_addrinfo_node *current;
  while (head) {
    current = head;
    head    = head->ai_next;
    ares_free(current->ai_addr);
    ares_free(current);
  }
}